

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

Stream * rw::readNativeData(Stream *stream,int32 len,void *object,int32 o,int32 s)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 platform;
  uint32 libid;
  ChunkHeaderInfo header;
  int32 s_local;
  int32 o_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  header.version = s;
  header.build = o;
  (*stream->_vptr_Stream[5])(stream,0xfffffffc,1);
  uVar1 = Stream::readU32(stream);
  readChunkHeaderInfo(stream,(ChunkHeaderInfo *)&platform);
  stream_local = stream;
  if ((platform == 1) && (uVar2 = libraryIDPack(header.type,header.length), uVar2 == uVar1)) {
    uVar1 = Stream::readU32(stream);
    (*stream->_vptr_Stream[5])(stream,0xfffffff0,1);
    if (uVar1 == 4) {
      stream_local = ps2::readNativeData(stream,len,object,header.build,header.version);
    }
    else if (uVar1 == 5) {
      stream_local = xbox::readNativeData(stream,len,object,header.build,header.version);
    }
    else if (uVar1 == 8) {
      stream_local = d3d8::readNativeData(stream,len,object,header.build,header.version);
    }
    else if (uVar1 == 9) {
      stream_local = d3d9::readNativeData(stream,len,object,header.build,header.version);
    }
    else {
      fprintf(_stderr,"unknown platform %d\n",(ulong)uVar1);
      (*stream->_vptr_Stream[5])(stream,(ulong)(uint)len,1);
    }
  }
  else {
    (*stream->_vptr_Stream[5])(stream,0xfffffff4,1);
    wdgl::readNativeData(stream,len,object,header.build,header.version);
  }
  return stream_local;
}

Assistant:

static Stream*
readNativeData(Stream *stream, int32 len, void *object, int32 o, int32 s)
{
	ChunkHeaderInfo header;
	uint32 libid;
	uint32 platform;
	// ugly hack to find out platform
	stream->seek(-4);
	libid = stream->readU32();
	readChunkHeaderInfo(stream, &header);
	if(header.type == ID_STRUCT &&
	   libraryIDPack(header.version, header.build) == libid){
		platform = stream->readU32();
		stream->seek(-16);
		if(platform == PLATFORM_PS2)
			return ps2::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_XBOX)
			return xbox::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_D3D8)
			return d3d8::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_D3D9)
			return d3d9::readNativeData(stream, len, object, o, s);
		else{
			fprintf(stderr, "unknown platform %d\n", platform);
			stream->seek(len);
		}
	}else{
		stream->seek(-12);
		wdgl::readNativeData(stream, len, object, o, s);
	}
	return stream;
}